

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

int jas_stream_display(jas_stream_t *stream,FILE *fp,int n)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ushort **ppuVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uchar buf [16];
  byte abStack_48 [24];
  
  uVar4 = n + 0xf;
  if (-1 < n) {
    uVar4 = n;
  }
  if (0 < n) {
    uVar9 = 0;
    bVar3 = true;
    do {
      bVar2 = (int)(uVar4 & 0xfffffff0) <= (int)uVar9;
      if (uVar9 == 0) {
        bVar2 = bVar3;
      }
      if (n < 0x11) {
        bVar2 = bVar3;
      }
      if (bVar2) {
        fprintf((FILE *)fp,"%08x:",(ulong)uVar9);
      }
      uVar8 = n - uVar9;
      uVar6 = 0x10;
      if ((int)uVar8 < 0x10) {
        uVar6 = (ulong)uVar8;
      }
      if (0 < (int)uVar8) {
        uVar11 = 0;
        do {
          uVar5 = 0xffffffff;
          if ((stream->flags_ & 7U) == 0) {
            if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
              iVar10 = stream->cnt_;
              stream->cnt_ = iVar10 + -1;
              if (iVar10 < 1) {
                uVar5 = jas_stream_fillbuf(stream,1);
              }
              else {
                stream->rwcnt_ = stream->rwcnt_ + 1;
                pbVar1 = stream->ptr_;
                stream->ptr_ = pbVar1 + 1;
                uVar5 = (uint)*pbVar1;
              }
            }
            else {
              stream->flags_ = stream->flags_ | 4;
            }
          }
          if (uVar5 == 0xffffffff) {
            abort();
          }
          abStack_48[uVar11] = (byte)uVar5;
          uVar11 = uVar11 + 1;
        } while (uVar11 < uVar6);
      }
      if (bVar2) {
        if ((int)uVar8 < 1) {
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          do {
            fprintf((FILE *)fp," %02x",(ulong)abStack_48[uVar11]);
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar6);
        }
        fputc(0x20,(FILE *)fp);
        if ((uint)uVar11 < 0x10) {
          iVar10 = (uint)uVar11 - 0x10;
          do {
            fwrite("   ",3,1,(FILE *)fp);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
        }
        if (0 < (int)uVar8) {
          ppuVar7 = __ctype_b_loc();
          uVar11 = 0;
          do {
            uVar8 = 0x20;
            if (((*ppuVar7)[abStack_48[uVar11]] >> 0xe & 1) != 0) {
              uVar8 = (uint)abStack_48[uVar11];
            }
            fputc(uVar8,(FILE *)fp);
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar6);
        }
        fputc(10,(FILE *)fp);
      }
      uVar9 = uVar9 + 0x10;
      bVar3 = bVar2;
    } while ((int)uVar9 < n);
  }
  return 0;
}

Assistant:

int jas_stream_display(jas_stream_t *stream, FILE *fp, int n)
{
	unsigned char buf[16];
	int i;
	int j;
	int m;
	int c;
	int display;
	int cnt;

	cnt = n - (n % 16);
	display = 1;

	for (i = 0; i < n; i += 16) {
		if (n > 16 && i > 0) {
			display = (i >= cnt) ? 1 : 0;
		}
		if (display) {
			fprintf(fp, "%08x:", i);
		}
		m = JAS_MIN(n - i, 16);
		for (j = 0; j < m; ++j) {
			if ((c = jas_stream_getc(stream)) == EOF) {
				abort();
				return -1;
			}
			buf[j] = c;
		}
		if (display) {
			for (j = 0; j < m; ++j) {
				fprintf(fp, " %02x", buf[j]);
			}
			fputc(' ', fp);
			for (; j < 16; ++j) {
				fprintf(fp, "   ");
			}
			for (j = 0; j < m; ++j) {
				if (isprint(buf[j])) {
					fputc(buf[j], fp);
				} else {
					fputc(' ', fp);
				}
			}
			fprintf(fp, "\n");
		}


	}
	return 0;
}